

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

void __thiscall rtosc::UndoHistory::seekHistory(UndoHistory *this,int distance)

{
  long lVar1;
  UndoHistoryImpl *pUVar2;
  size_type sVar3;
  reference ppVar4;
  long lVar5;
  bool bVar6;
  
  lVar1 = this->impl->history_pos;
  lVar5 = lVar1 + distance;
  if (lVar5 < 0) {
    distance = -(int)lVar1;
  }
  sVar3 = std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
          ::size(&this->impl->history);
  if ((long)sVar3 < lVar5) {
    sVar3 = std::
            deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
            size(&this->impl->history);
    distance = (int)sVar3 - (int)this->impl->history_pos;
  }
  if (distance != 0) {
    if (distance < 0) {
      for (; distance != 0; distance = distance + 1) {
        pUVar2 = this->impl;
        lVar5 = pUVar2->history_pos + -1;
        pUVar2->history_pos = lVar5;
        ppVar4 = std::
                 _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
                 ::operator[](&(pUVar2->history).
                               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                               ._M_impl.super__Deque_impl_data._M_start,lVar5);
        UndoHistoryImpl::rewind(pUVar2,(FILE *)ppVar4->second);
      }
    }
    else {
      while (bVar6 = distance != 0, distance = distance + -1, bVar6) {
        pUVar2 = this->impl;
        lVar5 = pUVar2->history_pos;
        pUVar2->history_pos = lVar5 + 1;
        ppVar4 = std::
                 _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
                 ::operator[](&(pUVar2->history).
                               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                               ._M_impl.super__Deque_impl_data._M_start,lVar5);
        UndoHistoryImpl::replay(pUVar2,ppVar4->second);
      }
    }
  }
  return;
}

Assistant:

void UndoHistory::seekHistory(int distance)
{
    //TODO print out the events that would need to take place to get to the
    //final destination
    
    //TODO limit the distance to be to applicable sizes
    //ie ones that do not exceed the known history/future
    long dest = impl->history_pos + distance;
    if(dest < 0)
        distance -= dest;
    if(dest > (long) impl->history.size())
        distance  = impl->history.size() - impl->history_pos;
    if(!distance)
        return;
    
    //TODO account for traveling back in time
    if(distance<0)
        while(distance++)
            impl->rewind(impl->history[--impl->history_pos].second);
    else
        while(distance--)
            impl->replay(impl->history[impl->history_pos++].second);
}